

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

BOOL __thiscall
Js::RecyclablePromiseObjectWalker::Get
          (RecyclablePromiseObjectWalker *this,int i,ResolvedObject *pResolvedObject)

{
  JavascriptLibrary *pJVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  JavascriptPromise *pJVar5;
  StaticType *type;
  undefined4 *puVar6;
  JavascriptString *aValue;
  RecyclableObject *this_00;
  IDiagObjectModelDisplay *pIVar7;
  Recycler *recycler;
  charcount_t charLength;
  char16 *content;
  Type TVar8;
  
  pJVar5 = VarTo<Js::JavascriptPromise>((this->super_RecyclableObjectWalker).instance);
  if (i == 1) {
    pResolvedObject->name = L"[value]";
    aValue = (JavascriptString *)(pJVar5->result).ptr;
    if (aValue == (JavascriptString *)0x0) goto switchD_008c8f87_caseD_0;
    goto LAB_008c90f0;
  }
  if (i != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xf1c,"(false)","false");
    if (bVar3) {
      *puVar6 = 0;
      return 0;
    }
    goto LAB_008c9316;
  }
  pResolvedObject->name = L"[status]";
  switch(pJVar5->status) {
  case PromiseStatusCode_Unresolved:
    pJVar1 = (((this->super_RecyclableObjectWalker).scriptContext)->super_ScriptContextBase).
             javascriptLibrary;
    type = StringCache::GetStringTypeStatic(&pJVar1->stringCache);
    recycler = pJVar1->recycler;
    content = L"pending";
    charLength = 7;
    goto LAB_008c907f;
  case PromiseStatusCode_HasResolution:
    pJVar1 = (((this->super_RecyclableObjectWalker).scriptContext)->super_ScriptContextBase).
             javascriptLibrary;
    type = StringCache::GetStringTypeStatic(&pJVar1->stringCache);
    recycler = pJVar1->recycler;
    content = L"resolved";
    goto LAB_008c9077;
  case PromiseStatusCode_HasRejection:
    pJVar1 = (((this->super_RecyclableObjectWalker).scriptContext)->super_ScriptContextBase).
             javascriptLibrary;
    type = StringCache::GetStringTypeStatic(&pJVar1->stringCache);
    recycler = pJVar1->recycler;
    content = L"rejected";
LAB_008c9077:
    charLength = 8;
LAB_008c907f:
    aValue = &LiteralString::New(type,content,charLength,recycler)->super_JavascriptString;
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xf0f,"(false)","New PromiseStatusCode not handled in debugger");
    if (!bVar3) goto LAB_008c9316;
    *puVar6 = 0;
  case PromiseStatusCode_Undefined:
switchD_008c8f87_caseD_0:
    aValue = StringCache::GetUndefinedDisplay
                       (&((((this->super_RecyclableObjectWalker).scriptContext)->
                          super_ScriptContextBase).javascriptLibrary)->stringCache);
  }
LAB_008c90f0:
  pResolvedObject->obj = aValue;
  pResolvedObject->propId = -1;
  pResolvedObject->scriptContext = (this->super_RecyclableObjectWalker).scriptContext;
  if (aValue == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_008c9316;
    *puVar6 = 0;
  }
  if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_008c9316;
    *puVar6 = 0;
  }
  TVar8 = TypeIds_FirstNumberType;
  if ((((ulong)aValue & 0xffff000000000000) != 0x1000000000000) &&
     (TVar8 = TypeIds_Number, (ulong)aValue >> 0x32 == 0)) {
    this_00 = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (this_00 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_008c9316;
      *puVar6 = 0;
    }
    TVar8 = ((this_00->type).ptr)->typeId;
    if ((0x57 < (int)TVar8) && (BVar4 = RecyclableObject::IsExternal(this_00), BVar4 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar3) {
LAB_008c9316:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
  }
  pResolvedObject->typeId = TVar8;
  pIVar7 = ResolvedObject::CreateDisplay(pResolvedObject);
  pResolvedObject->objectDisplay = pIVar7;
  (*pIVar7->_vptr_IDiagObjectModelDisplay[6])(pIVar7,0x820);
  pResolvedObject->address = (IDiagObjectAddress *)0x0;
  return 1;
}

Assistant:

BOOL RecyclablePromiseObjectWalker::Get(int i, ResolvedObject* pResolvedObject)
    {
        JavascriptPromise* promise = VarTo<JavascriptPromise>(instance);

        if (i == 0)
        {
            pResolvedObject->name = _u("[status]");

            switch (promise->GetStatus())
            {
            case JavascriptPromise::PromiseStatusCode_Undefined:
                pResolvedObject->obj = scriptContext->GetLibrary()->GetUndefinedDisplayString();
                break;
            case JavascriptPromise::PromiseStatusCode_Unresolved:
                pResolvedObject->obj = scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("pending"));
                break;
            case JavascriptPromise::PromiseStatusCode_HasResolution:
                pResolvedObject->obj = scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("resolved"));
                break;
            case JavascriptPromise::PromiseStatusCode_HasRejection:
                pResolvedObject->obj = scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("rejected"));
                break;
            default:
                AssertMsg(false, "New PromiseStatusCode not handled in debugger");
                pResolvedObject->obj = scriptContext->GetLibrary()->GetUndefinedDisplayString();
                break;
            }
        }
        else if (i == 1)
        {
            pResolvedObject->name = _u("[value]");
            Var result = promise->GetResult();
            pResolvedObject->obj = result != nullptr ? result : scriptContext->GetLibrary()->GetUndefinedDisplayString();
        }
        else
        {
            Assert(false);
            return FALSE;
        }

        pResolvedObject->propId = Constants::NoProperty;
        pResolvedObject->scriptContext = scriptContext;
        pResolvedObject->typeId = JavascriptOperators::GetTypeId(pResolvedObject->obj);
        pResolvedObject->objectDisplay = pResolvedObject->CreateDisplay();
        pResolvedObject->objectDisplay->SetDefaultTypeAttribute(DBGPROP_ATTRIB_VALUE_READONLY | DBGPROP_ATTRIB_VALUE_IS_FAKE);
        pResolvedObject->address = nullptr;

        return TRUE;
    }